

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O3

bool boost::filesystem::detail::create_directories(path *p,error_code *ec)

{
  bool bVar1;
  int iVar2;
  error_category *peVar3;
  filesystem_error *this;
  error_code ec_00;
  path parent;
  error_code local_res20;
  file_status parent_status;
  file_status p_status;
  path filename;
  path local_98;
  error_code local_78;
  int local_68 [2];
  int local_60 [2];
  path local_58;
  string local_38;
  
  path::filename(&local_58,p);
  if (local_58.m_pathname._M_string_length == 2) {
    if ((*local_58.m_pathname._M_dataplus._M_p == '.') &&
       (local_58.m_pathname._M_dataplus._M_p[1] == '.')) goto LAB_0010bf97;
LAB_0010bfb2:
    local_78.m_val = 0;
    local_78.m_cat = system::system_category();
    status((detail *)local_60,p,&local_78);
    if (local_60[0] == 3) {
      if (ec != (error_code *)0x0) {
        ec->m_val = 0;
        peVar3 = system::system_category();
        ec->m_cat = peVar3;
      }
      bVar1 = false;
      goto LAB_0010c085;
    }
    path::parent_path(&local_98,p);
    iVar2 = path::compare(&local_98,p);
    if (iVar2 == 0) {
      __assert_fail("(parent != p)&&(\"internal error: p == p.parent_path()\")",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/libs/filesystem/src/operations.cpp"
                    ,0x3bd,
                    "bool boost::filesystem::detail::create_directories(const path &, system::error_code *)"
                   );
    }
    if (((local_98.m_pathname._M_string_length == 0) ||
        (status((detail *)local_68,&local_98,&local_78), local_68[0] != 1)) ||
       (create_directories(&local_98,&local_78), local_78.m_val == 0)) {
      bVar1 = create_directory(p,ec);
    }
    else {
      if (ec == (error_code *)0x0) {
        this = (filesystem_error *)__cxa_allocate_exception(0x50);
        local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_38,"boost::filesystem::create_directories","");
        ec_00._4_4_ = 0;
        ec_00.m_val = local_78.m_val;
        ec_00.m_cat = local_78.m_cat;
        filesystem_error::filesystem_error(this,&local_38,&local_98,ec_00);
        __cxa_throw(this,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
      }
      *(ulong *)ec = CONCAT44(local_78._4_4_,local_78.m_val);
      ec->m_cat = local_78.m_cat;
      bVar1 = false;
    }
  }
  else {
    if ((local_58.m_pathname._M_string_length != 1) ||
       (*local_58.m_pathname._M_dataplus._M_p != '.')) goto LAB_0010bfb2;
LAB_0010bf97:
    path::parent_path(&local_98,p);
    bVar1 = create_directories(&local_98,ec);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.m_pathname._M_dataplus._M_p != &local_98.m_pathname.field_2) {
    operator_delete(local_98.m_pathname._M_dataplus._M_p,
                    local_98.m_pathname.field_2._M_allocated_capacity + 1);
  }
LAB_0010c085:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.m_pathname._M_dataplus._M_p != &local_58.m_pathname.field_2) {
    operator_delete(local_58.m_pathname._M_dataplus._M_p,
                    local_58.m_pathname.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

BOOST_FILESYSTEM_DECL
  bool create_directories(const path& p, system::error_code* ec)
  {
    path filename(p.filename());
    if ((filename.native().size() == 1 && filename.native()[0] == dot)
      || (filename.native().size() == 2
        && filename.native()[0] == dot && filename.native()[1] == dot))
      return create_directories(p.parent_path(), ec);

    error_code local_ec;
    file_status p_status = status(p, local_ec);

    if (p_status.type() == directory_file)
    {
      if (ec != 0)
        ec->clear();
      return false;
    }

    path parent = p.parent_path();
    BOOST_ASSERT_MSG(parent != p, "internal error: p == p.parent_path()");
    if (!parent.empty())
    {
      // determine if the parent exists
      file_status parent_status = status(parent, local_ec);

      // if the parent does not exist, create the parent
      if (parent_status.type() == file_not_found)
      {
        create_directories(parent, local_ec);
        if (local_ec)
        {
          if (ec == 0)
            BOOST_FILESYSTEM_THROW(filesystem_error(
              "boost::filesystem::create_directories", parent, local_ec));
          else
            *ec = local_ec;
          return false;
        }
      }
    }

    // create the directory
    return create_directory(p, ec);
  }